

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intmul_k64(jit_State *J)

{
  jit_State *in_RDI;
  jit_State *in_stack_ffffffffffffffe8;
  TRef local_4;
  
  if (*(long *)(ulong)(in_RDI->fold).right.field_1.op12 == 0) {
    local_4 = lj_ir_kint64(in_RDI,(uint64_t)in_stack_ffffffffffffffe8);
  }
  else if (*(ulong *)(ulong)(in_RDI->fold).right.field_1.op12 < 0x80000000) {
    local_4 = simplify_intmul_k(in_stack_ffffffffffffffe8,0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LJFOLD(MUL any KINT64)
LJFOLDF(simplify_intmul_k64)
{
  if (ir_kint64(fright)->u64 == 0)  /* i * 0 ==> 0 */
    return INT64FOLD(0);
#if LJ_64
  /* NYI: SPLIT for BSHL and 32 bit backend support. */
  else if (ir_kint64(fright)->u64 < 0x80000000u)
    return simplify_intmul_k(J, (int32_t)ir_kint64(fright)->u64);
#endif
  return NEXTFOLD;
}